

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct_fuzzer.cc
# Opt level: O0

void __thiscall FuzzHelper::run(FuzzHelper *this)

{
  runtime_error *e;
  FuzzHelper *this_local;
  
  doChecks(this);
  return;
}

Assistant:

void
FuzzHelper::run()
{
    try {
        doChecks();
    } catch (std::runtime_error const& e) {
        std::cerr << "runtime_error: " << e.what() << std::endl;
    }
}